

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssse3_gemm.h
# Opt level: O2

void intgemm::SSSE3::Kernels8::PrepareA
               (float *input,uint8_t *output,float quant_mult,Index rows,Index cols)

{
  QuantizeU(input,output,quant_mult,rows * cols);
  return;
}

Assistant:

INTGEMM_SSSE3 static inline void PrepareA(const float *input, uint8_t *output, float quant_mult, Index rows, Index cols) {
    QuantizeU(input, output, quant_mult, rows * cols);
  }